

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.h
# Opt level: O1

void __thiscall chatra::Reader::registerPointer<chatra::Lock>(Reader *this,Lock *ptr)

{
  pointer *ppPVar1;
  iterator __position;
  pointer pPVar2;
  
  __position._M_current =
       (this->pointerList).
       super__Vector_base<chatra::Reader::PointerInfo,_std::allocator<chatra::Reader::PointerInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->pointerList).
      super__Vector_base<chatra::Reader::PointerInfo,_std::allocator<chatra::Reader::PointerInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<chatra::Reader::PointerInfo,_std::allocator<chatra::Reader::PointerInfo>_>::
    _M_realloc_insert<>(&this->pointerList,__position);
  }
  else {
    *(undefined8 *)__position._M_current = 0;
    (__position._M_current)->raw = (void *)0x0;
    ppPVar1 = &(this->pointerList).
               super__Vector_base<chatra::Reader::PointerInfo,_std::allocator<chatra::Reader::PointerInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppPVar1 = *ppPVar1 + 1;
  }
  pPVar2 = (this->pointerList).
           super__Vector_base<chatra::Reader::PointerInfo,_std::allocator<chatra::Reader::PointerInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pPVar2[-1].mode = Raw;
  pPVar2[-1].raw = ptr;
  return;
}

Assistant:

void registerPointer(Type* ptr) {
		chatra_assert(ptr != nullptr);
		pointerList.emplace_back();
		auto& p = pointerList.back();
		p.mode = PointerMode::Raw;
		p.raw = ptr;
	}